

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O1

Importbin * __thiscall
jsonnet::internal::Allocator::
make<jsonnet::internal::Importbin,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::LiteralString*&>
          (Allocator *this,LocationRange *args,
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *args_1,LiteralString **args_2)

{
  size_t *psVar1;
  LiteralString *pLVar2;
  Importbin *this_00;
  _List_node_base *p_Var3;
  
  this_00 = (Importbin *)operator_new(0x88);
  pLVar2 = *args_2;
  AST::AST((AST *)this_00,args,AST_IMPORTBIN,args_1);
  (this_00->super_AST)._vptr_AST = (_func_int **)&PTR__AST_0019c8c8;
  this_00->file = pLVar2;
  p_Var3 = (_List_node_base *)operator_new(0x18);
  p_Var3[1]._M_next = (_List_node_base *)this_00;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  psVar1 = &(this->allocated).
            super__List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>.
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  return this_00;
}

Assistant:

T *make(Args &&... args)
    {
        auto r = new T(std::forward<Args>(args)...);
        allocated.push_back(r);
        return r;
    }